

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_goiftrue(FuncState *fs,expdesc *e)

{
  expkind eVar1;
  int vtarget;
  int iVar2;
  Instruction *pIVar3;
  
  luaK_dischargevars(fs,e);
  eVar1 = e->k;
  iVar2 = -1;
  if ((3 < eVar1 - VK) && (eVar1 != VTRUE)) {
    if (eVar1 == VJMP) {
      pIVar3 = fs->f->code + (e->u).info;
      if ((0 < (long)(e->u).info) && (("\b\n\n\t\t\b\b\b\b\b"[pIVar3[-1] & 0x7f] & 0x10) != 0)) {
        pIVar3 = pIVar3 + -1;
      }
      *(byte *)((long)pIVar3 + 1) = *(byte *)((long)pIVar3 + 1) ^ 0x80;
      iVar2 = (e->u).info;
    }
    else {
      iVar2 = jumponcond(fs,e,0);
    }
  }
  luaK_concat(fs,&e->f,iVar2);
  iVar2 = e->t;
  vtarget = fs->pc;
  fs->lasttarget = vtarget;
  patchlistaux(fs,iVar2,vtarget,0xff,vtarget);
  e->t = -1;
  return;
}

Assistant:

void luaK_goiftrue (FuncState *fs, expdesc *e) {
  int pc;  /* pc of new jump */
  luaK_dischargevars(fs, e);
  switch (e->k) {
    case VJMP: {  /* condition? */
      negatecondition(fs, e);  /* jump when it is false */
      pc = e->u.info;  /* save jump position */
      break;
    }
    case VK: case VKFLT: case VKINT: case VKSTR: case VTRUE: {
      pc = NO_JUMP;  /* always true; do nothing */
      break;
    }
    default: {
      pc = jumponcond(fs, e, 0);  /* jump when false */
      break;
    }
  }
  luaK_concat(fs, &e->f, pc);  /* insert new jump in false list */
  luaK_patchtohere(fs, e->t);  /* true list jumps to here (to go through) */
  e->t = NO_JUMP;
}